

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

Index __thiscall wasm::Wasm2JSBuilder::getDataIndex(Wasm2JSBuilder *this,Name segment)

{
  __node_base_ptr p_Var1;
  _Hash_node_base *p_Var2;
  undefined1 local_20 [8];
  Name segment_local;
  
  segment_local.super_IString.str._M_len = segment.super_IString.str._M_str;
  local_20 = segment.super_IString.str._M_len;
  p_Var2 = (_Hash_node_base *)0x0;
  p_Var1 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)this,segment_local.super_IString.str._M_len %
                              (this->dataIndices)._M_h._M_bucket_count,(key_type *)local_20,
                      segment_local.super_IString.str._M_len);
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var2 = p_Var1->_M_nxt;
  }
  if (p_Var2 != (_Hash_node_base *)0x0) {
    return *(Index *)&p_Var2[3]._M_nxt;
  }
  __assert_fail("it != dataIndices.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                ,199,"Index wasm::Wasm2JSBuilder::getDataIndex(Name)");
}

Assistant:

Index getDataIndex(Name segment) {
    auto it = dataIndices.find(segment);
    assert(it != dataIndices.end());
    return it->second;
  }